

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_utils.hpp
# Opt level: O0

streampos __thiscall ELFIO::address_translator::operator[](address_translator *this,streampos value)

{
  streampos sVar1;
  bool bVar2;
  fpos<__mbstate_t> *__other;
  streamoff sVar3;
  streamoff sVar4;
  address_translation *t;
  const_iterator __end2;
  const_iterator __begin2;
  vector<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_> *__range2;
  address_translator *this_local;
  streampos value_local;
  __mbstate_t local_10;
  
  value_local._M_off = (streamoff)value._M_state;
  this_local = (address_translator *)value._M_off;
  bVar2 = std::vector<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>::
          empty(&this->addr_translations);
  if (bVar2) {
    value_local._M_state = (__mbstate_t)this_local;
    local_10.__count = (undefined4)value_local._M_off;
    local_10.__value = (anon_union_4_2_91654ee9_for___value)value_local._M_off._4_4_;
  }
  else {
    __end2 = std::vector<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>::
             begin(&this->addr_translations);
    t = (address_translation *)
        std::vector<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>::end
                  (&this->addr_translations);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_ELFIO::address_translation_*,_std::vector<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>_>
                                  *)&t);
      if (!bVar2) break;
      __other = (fpos<__mbstate_t> *)
                __gnu_cxx::
                __normal_iterator<const_ELFIO::address_translation_*,_std::vector<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>_>
                ::operator*(&__end2);
      sVar3 = std::fpos::operator_cast_to_long((fpos *)__other);
      sVar4 = std::fpos::operator_cast_to_long((fpos *)&this_local);
      if (sVar3 <= sVar4) {
        sVar3 = std::fpos<__mbstate_t>::operator-((fpos<__mbstate_t> *)&this_local,__other);
        sVar4 = std::fpos::operator_cast_to_long((fpos *)(__other + 1));
        if (sVar3 < sVar4) {
          sVar3 = std::fpos<__mbstate_t>::operator-((fpos<__mbstate_t> *)&this_local,__other);
          sVar4 = std::fpos::operator_cast_to_long((fpos *)(__other + 2));
          std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)&value_local._M_state,sVar3 + sVar4);
          goto LAB_001081dd;
        }
      }
      __gnu_cxx::
      __normal_iterator<const_ELFIO::address_translation_*,_std::vector<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>_>
      ::operator++(&__end2);
    }
    value_local._M_state = (__mbstate_t)this_local;
    local_10.__count = (undefined4)value_local._M_off;
    local_10.__value = (anon_union_4_2_91654ee9_for___value)value_local._M_off._4_4_;
  }
LAB_001081dd:
  sVar1._M_state = local_10;
  sVar1._M_off._0_4_ = value_local._M_state.__count;
  sVar1._M_off._4_4_ = value_local._M_state.__value;
  return sVar1;
}

Assistant:

std::streampos operator[]( std::streampos value ) const
    {
        if ( addr_translations.empty() ) {
            return value;
        }

        for ( auto& t : addr_translations ) {
            if ( ( t.start <= value ) && ( ( value - t.start ) < t.size ) ) {
                return value - t.start + t.mapped_to;
            }
        }

        return value;
    }